

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipFieldValue(ParserImpl *this)

{
  Tokenizer *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TokenType TVar2;
  pointer pcVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  _Alloc_hider _Var8;
  string text;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->tokenizer_;
  if ((this->tokenizer_).current_.type == TYPE_STRING) {
    do {
      io::Tokenizer::Next(this_00);
    } while ((this_00->current_).type == TYPE_STRING);
    return true;
  }
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"[","");
  bVar5 = TryConsume(this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (bVar5) {
    do {
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{","");
      _Var8._M_p = local_70._M_dataplus._M_p;
      sVar7 = (this->tokenizer_).current_.text._M_string_length;
      if ((sVar7 == local_70._M_string_length) &&
         ((sVar7 == 0 ||
          (iVar6 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_70._M_dataplus._M_p,
                        sVar7), iVar6 == 0)))) {
        bVar5 = false;
      }
      else {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"<","");
        _Var4._M_p = local_50._M_dataplus._M_p;
        sVar7 = (this->tokenizer_).current_.text._M_string_length;
        if (sVar7 == local_50._M_string_length) {
          if (sVar7 == 0) {
            bVar5 = false;
          }
          else {
            iVar6 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_50._M_dataplus._M_p
                         ,sVar7);
            bVar5 = iVar6 != 0;
          }
        }
        else {
          bVar5 = true;
        }
        _Var8._M_p = local_70._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var4._M_p != &local_50.field_2) {
          operator_delete(_Var4._M_p);
          _Var8._M_p = local_70._M_dataplus._M_p;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var8._M_p != paVar1) {
        operator_delete(_Var8._M_p);
      }
      if (bVar5) {
        bVar5 = SkipFieldValue(this);
      }
      else {
        bVar5 = SkipFieldMessage(this);
      }
      if (bVar5 == false) {
        return false;
      }
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"]","");
      bVar5 = TryConsume(this,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (bVar5) {
        return true;
      }
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,",","");
      bVar5 = Consume(this,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    } while (bVar5);
    return false;
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"-","");
  bVar5 = TryConsume(this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  TVar2 = (this_00->current_).type;
  if (1 < TVar2 - TYPE_INTEGER) {
    if (TVar2 != TYPE_IDENTIFIER) {
      pcVar3 = (this->tokenizer_).current_.text._M_dataplus._M_p;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar3,
                 pcVar3 + (this->tokenizer_).current_.text._M_string_length);
      std::operator+(&local_50,"Cannot skip field value, unexpected token: ",&local_70);
      ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,&local_50
                 );
LAB_002a6f91:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      return false;
    }
    if (bVar5) {
      pcVar3 = (this->tokenizer_).current_.text._M_dataplus._M_p;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar3,
                 pcVar3 + (this->tokenizer_).current_.text._M_string_length);
      if (local_70._M_string_length != 0) {
        sVar7 = 0;
        do {
          if ((byte)(local_70._M_dataplus._M_p[sVar7] + 0xbfU) < 0x1a) {
            local_70._M_dataplus._M_p[sVar7] = local_70._M_dataplus._M_p[sVar7] | 0x20;
          }
          sVar7 = sVar7 + 1;
        } while (local_70._M_string_length != sVar7);
      }
      iVar6 = std::__cxx11::string::compare((char *)&local_70);
      if (((iVar6 != 0) && (iVar6 = std::__cxx11::string::compare((char *)&local_70), iVar6 != 0))
         && (iVar6 = std::__cxx11::string::compare((char *)&local_70), iVar6 != 0)) {
        std::operator+(&local_50,"Invalid float number: ",&local_70);
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    &local_50);
        goto LAB_002a6f91;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
  }
  io::Tokenizer::Next(this_00);
  return true;
}

Assistant:

bool LookingAtType(io::Tokenizer::TokenType token_type) {
    return tokenizer_.current().type == token_type;
  }